

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::AbstractDOMParser::startElement
          (AbstractDOMParser *this,XMLElementDecl *elemDecl,uint urlId,XMLCh *elemPrefix,
          RefVectorOf<xercesc_4_0::XMLAttr> *attrList,XMLSize_t attrCount,bool isEmpty,bool isRoot)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  XMLScanner *pXVar4;
  QName *pQVar5;
  DOMDocumentImpl *pDVar6;
  DOMNode *p;
  bool bVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _func_int **pp_Var10;
  undefined4 extraout_var_01;
  XMLAttr *this_00;
  DOMNode *pDVar11;
  XMLCh *pXVar12;
  XMLCh *pXVar13;
  undefined4 extraout_var_03;
  DOMNodeIDMap *this_01;
  long *plVar14;
  ulong uVar15;
  long *plVar16;
  XMLCh *pXVar17;
  undefined8 uVar18;
  long *plVar19;
  long *plVar20;
  XMLCh *pXVar21;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  DOMParentNode *pDVar22;
  DOMDocument *doc;
  XMLSize_t index;
  XMLSize_t getAt;
  ulong uVar23;
  pointer_____offset_0x10___ *ppuVar24;
  XMLSize_t XVar25;
  uint uriId;
  DOMNode *local_88;
  XMLBufBid elemQName;
  int colonPos;
  XMLSize_t local_48;
  DOMAttrMapImpl *local_40;
  XMLCh *local_38;
  undefined4 extraout_var_02;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  
  pXVar4 = this->fScanner;
  bVar1 = pXVar4->fDoNamespaces;
  local_48 = attrCount;
  local_38 = elemPrefix;
  if (bVar1 == true) {
    pXVar17 = elemDecl->fElementName->fLocalPart;
    if (pXVar4->fEmptyNamespaceId == urlId) {
      pp_Var10 = (this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler;
      pXVar21 = (XMLCh *)0x0;
    }
    else {
      pXVar21 = XMLScanner::getURIText(pXVar4,urlId);
      if ((elemPrefix != (XMLCh *)0x0) && (*elemPrefix != L'\0')) {
        elemQName.fBuffer = XMLBufferMgr::bidOnBuffer(&this->fBufMgr);
        elemQName.fMgr = &this->fBufMgr;
        XMLBuffer::set(elemQName.fBuffer,elemPrefix,0);
        XMLBuffer::append(elemQName.fBuffer,L':');
        XMLBuffer::append(elemQName.fBuffer,pXVar17);
        (elemQName.fBuffer)->fBuffer[(elemQName.fBuffer)->fIndex] = L'\0';
        iVar8 = (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x25])
                          (this,pXVar21,elemPrefix);
        local_88 = (DOMNode *)CONCAT44(extraout_var_00,iVar8);
        XMLBufBid::~XMLBufBid(&elemQName);
        goto LAB_002d4e2e;
      }
      pp_Var10 = (this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler;
    }
    iVar8 = (*pp_Var10[0x25])(this,pXVar21,0,pXVar17,pXVar17);
    local_88 = (DOMNode *)CONCAT44(extraout_var_01,iVar8);
  }
  else {
    pXVar17 = XMLElementDecl::getFullName(elemDecl);
    iVar8 = (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x24])(this,pXVar17);
    local_88 = (DOMNode *)CONCAT44(extraout_var,iVar8);
  }
LAB_002d4e2e:
  XVar25 = local_48;
  if (local_48 != 0) {
    uVar9 = this->fScanner->fEmptyNamespaceId;
    uVar2 = this->fScanner->fXMLNSNamespaceId;
    local_40 = (DOMAttrMapImpl *)local_88[0xf]._vptr_DOMNode;
    DOMAttrMapImpl::reserve(local_40,local_48);
    for (getAt = 0; XVar25 != getAt; getAt = getAt + 1) {
      this_00 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                          (&attrList->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,getAt);
      pQVar5 = this_00->fAttName;
      if (bVar1 == false) {
        iVar8 = (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x26])
                          (this,pQVar5->fLocalPart);
        pDVar11 = (DOMNode *)CONCAT44(extraout_var_02,iVar8);
        DOMAttrMapImpl::setNamedItemFast(local_40,pDVar11);
      }
      else {
        uVar3 = pQVar5->fURIId;
        pXVar17 = pQVar5->fLocalPart;
        pXVar21 = pQVar5->fPrefix;
        if (((pXVar21 == (XMLCh *)0x0) || (uriId = uVar3, *pXVar21 == L'\0')) &&
           (bVar7 = XMLString::equals(pXVar17,(XMLCh *)XMLUni::fgXMLNSString), uriId = uVar2, !bVar7
           )) {
          uriId = uVar3;
        }
        if (uriId == uVar9) {
          pXVar12 = (XMLCh *)0x0;
        }
        else {
          pXVar12 = XMLScanner::getURIText(this->fScanner,uriId);
        }
        pXVar13 = XMLAttr::getQName(this_00);
        iVar8 = (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[0x27])
                          (this,pXVar12,pXVar21,pXVar17,pXVar13);
        pDVar11 = (DOMNode *)CONCAT44(extraout_var_03,iVar8);
        DOMAttrMapImpl::setNamedItemNSFast(local_40,pDVar11);
        XVar25 = local_48;
      }
      (*pDVar11->_vptr_DOMNode[0x38])(pDVar11,this_00->fValue);
      if (this_00->fType == ID) {
        pDVar6 = this->fDocument;
        this_01 = pDVar6->fNodeIDMap;
        if (this_01 == (DOMNodeIDMap *)0x0) {
          iVar8 = (*(pDVar6->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])(pDVar6,0x30);
          this_01 = (DOMNodeIDMap *)CONCAT44(extraout_var_04,iVar8);
          doc = &this->fDocument->super_DOMDocument;
          if (this->fDocument == (DOMDocumentImpl *)0x0) {
            doc = (DOMDocument *)0x0;
          }
          DOMNodeIDMap::DOMNodeIDMap(this_01,500,doc);
          this->fDocument->fNodeIDMap = this_01;
        }
        DOMNodeIDMap::add(this_01,(DOMAttr *)pDVar11);
        *(ushort *)&pDVar11[5]._vptr_DOMNode = *(ushort *)&pDVar11[5]._vptr_DOMNode | 0x100;
      }
      (*pDVar11->_vptr_DOMNode[0x33])(pDVar11,(ulong)this_00->fSpecified);
      if (this->fCreateSchemaInfo == true) {
        ppuVar24 = &DOMTypeInfoImpl::g_DtdNotValidatedAttribute;
        if ((ulong)(uint)this_00->fType < 10) {
          ppuVar24 = (pointer_____offset_0x10___ *)
                     (&PTR_g_DtdValidatedCDATAAttribute_00403408)[(uint)this_00->fType];
        }
        (*pDVar11->_vptr_DOMNode[0x35])(pDVar11,ppuVar24);
      }
    }
  }
  iVar8 = (*(elemDecl->super_XSerializable)._vptr_XSerializable[7])();
  if ((char)iVar8 != '\0') {
    iVar8 = (*(elemDecl->super_XSerializable)._vptr_XSerializable[5])();
    plVar14 = (long *)CONCAT44(extraout_var_05,iVar8);
    for (uVar23 = 0; uVar15 = (**(code **)(*plVar14 + 0x50))(plVar14), uVar23 < uVar15;
        uVar23 = uVar23 + 1) {
      plVar16 = (long *)(**(code **)(*plVar14 + 0x58))(plVar14,uVar23);
      if (*(uint *)(plVar16 + 1) < 2) {
        if (bVar1 == false) {
          pDVar6 = this->fDocument;
          uVar18 = (**(code **)(*plVar16 + 0x28))(plVar16);
          iVar8 = (*(pDVar6->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x32])(pDVar6,uVar18);
          plVar19 = (long *)CONCAT44(extraout_var_06,iVar8);
          iVar8 = (*local_88->_vptr_DOMNode[0x48])(local_88,plVar19);
          plVar20 = (long *)CONCAT44(extraout_var_07,iVar8);
          if (plVar20 != (long *)0x0) {
            (**(code **)(*plVar20 + 0x138))(plVar20);
          }
        }
        else {
          pXVar17 = (XMLCh *)(**(code **)(*plVar16 + 0x28))(plVar16);
          elemQName.fBuffer = XMLBufferMgr::bidOnBuffer(&this->fBufMgr);
          colonPos = -1;
          elemQName.fMgr = &this->fBufMgr;
          uVar9 = XMLScanner::resolveQName
                            (this->fScanner,pXVar17,elemQName.fBuffer,Mode_Attribute,&colonPos);
          bVar7 = XMLString::equals(pXVar17,(XMLCh *)XMLUni::fgXMLNSString);
          pXVar4 = this->fScanner;
          if (bVar7) {
            uVar9 = pXVar4->fXMLNSNamespaceId;
          }
          if (uVar9 == pXVar4->fEmptyNamespaceId) {
            pXVar21 = (XMLCh *)0x0;
          }
          else {
            pXVar21 = XMLScanner::getURIText(pXVar4,uVar9);
          }
          iVar8 = (*(this->fDocument->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x53])
                            (this->fDocument,pXVar21,pXVar17);
          plVar19 = (long *)CONCAT44(extraout_var_08,iVar8);
          iVar8 = (*local_88->_vptr_DOMNode[0x49])(local_88,plVar19);
          plVar20 = (long *)CONCAT44(extraout_var_09,iVar8);
          if (plVar20 != (long *)0x0) {
            (**(code **)(*plVar20 + 0x138))(plVar20);
          }
          XMLBufBid::~XMLBufBid(&elemQName);
        }
        if (plVar16[4] != 0) {
          (**(code **)(*plVar19 + 0x1c0))(plVar19);
          (**(code **)(*plVar19 + 0x198))(plVar19,0);
        }
        if (this->fCreateSchemaInfo == true) {
          ppuVar24 = &DOMTypeInfoImpl::g_DtdNotValidatedAttribute;
          if ((ulong)*(uint *)((long)plVar16 + 0xc) < 10) {
            ppuVar24 = (pointer_____offset_0x10___ *)
                       (&PTR_g_DtdValidatedCDATAAttribute_00403408)[*(uint *)((long)plVar16 + 0xc)];
          }
          (**(code **)(*plVar19 + 0x1a8))(plVar19,ppuVar24);
        }
      }
      (**(code **)(*plVar16 + 0x30))(plVar16);
    }
  }
  pXVar17 = local_38;
  p = this->fCurrentParent;
  pDVar11 = &(this->fDocument->super_DOMDocument).super_DOMNode;
  if (this->fDocument == (DOMDocumentImpl *)0x0) {
    pDVar11 = (DOMNode *)0x0;
  }
  if (p == pDVar11) {
    (*p->_vptr_DOMNode[0x11])(p,local_88);
  }
  else {
    pDVar22 = castToParentImpl(p);
    (**pDVar22->_vptr_DOMParentNode)(pDVar22,local_88);
  }
  this->fCurrentParent = local_88;
  this->fCurrentNode = local_88;
  this->fWithinElement = true;
  if (isEmpty) {
    (*(this->super_XMLDocumentHandler)._vptr_XMLDocumentHandler[6])
              (this,elemDecl,(ulong)urlId,(ulong)isRoot,pXVar17);
  }
  return;
}

Assistant:

void AbstractDOMParser::startElement(const XMLElementDecl&   elemDecl
                             , const unsigned int            urlId
                             , const XMLCh* const            elemPrefix
                             , const RefVectorOf<XMLAttr>&   attrList
                             , const XMLSize_t               attrCount
                             , const bool                    isEmpty
                             , const bool                    isRoot)
{
    DOMElement     *elem;
    DOMElementImpl *elemImpl;
    const XMLCh* namespaceURI = 0;
    bool doNamespaces = fScanner->getDoNamespaces();

    // Create the element name. Here we are going to bypass the
    // DOMDocument::createElement() interface and instantiate the
    // required types directly in order to avoid name checking
    // overhead.
    //
    if (doNamespaces)
    {
        //DOM Level 2, doNamespaces on
        //
        const XMLCh* localName = elemDecl.getBaseName();

        if (urlId != fScanner->getEmptyNamespaceId()) {  //TagName has a prefix

            namespaceURI = fScanner->getURIText(urlId); //get namespaceURI

            if (elemPrefix && *elemPrefix)
            {
                XMLBufBid elemQName(&fBufMgr);

                elemQName.set(elemPrefix);
                elemQName.append(chColon);
                elemQName.append(localName);

                elem = createElementNS (
                  namespaceURI, elemPrefix, localName, elemQName.getRawBuffer());
            }
            else
              elem = createElementNS (namespaceURI, 0, localName, localName);
        }
        else
          elem = createElementNS (namespaceURI, 0, localName, localName);
    }
    else
    {   //DOM Level 1
        elem = createElement (elemDecl.getFullName());
    }

    elemImpl = (DOMElementImpl *) elem;

    if (attrCount)
    {
      unsigned int xmlnsNSId = fScanner->getXMLNSNamespaceId();
      unsigned int emptyNSId = fScanner->getEmptyNamespaceId();

      DOMAttrMapImpl* map = elemImpl->fAttributes;
      map->reserve (attrCount);

      for (XMLSize_t index = 0; index < attrCount; ++index)
      {
        const XMLAttr* oneAttrib = attrList.elementAt(index);
        DOMAttrImpl *attr = 0;

        if (doNamespaces)
        {
            //DOM Level 2, doNamespaces on
            //
            unsigned int attrURIId = oneAttrib->getURIId();
            const XMLCh* localName = oneAttrib->getName();
            const XMLCh* prefix = oneAttrib->getPrefix();
            namespaceURI = 0;

            if ((prefix==0 || *prefix==0) && XMLString::equals(localName, XMLUni::fgXMLNSString))
            {
                // xmlns=...
                attrURIId = xmlnsNSId;
            }
            if (attrURIId != emptyNSId)
            {
                //TagName has a prefix
                namespaceURI = fScanner->getURIText(attrURIId);
            }

            attr = (DOMAttrImpl*) createAttrNS (namespaceURI,
                                                prefix,
                                                localName,
                                                oneAttrib->getQName());

            map->setNamedItemNSFast(attr);
        }
        else
        {
            attr = (DOMAttrImpl*) createAttr (oneAttrib->getName());
            map->setNamedItemFast(attr);
        }

        attr->setValueFast(oneAttrib->getValue());

        // Attributes of type ID.  If this is one, add it to the hashtable of IDs
        //   that is constructed for use by GetElementByID().
        //
        if (oneAttrib->getType()==XMLAttDef::ID)
        {
            if (fDocument->fNodeIDMap == 0)
                fDocument->fNodeIDMap = new (fDocument) DOMNodeIDMap(500, fDocument);
            fDocument->fNodeIDMap->add(attr);
            attr->fNode.isIdAttr(true);
        }

        attr->setSpecified(oneAttrib->getSpecified());

        // store DTD validation information
        if(fCreateSchemaInfo)
        {
            switch(oneAttrib->getType())
            {
            case XMLAttDef::CData:          attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedCDATAAttribute); break;
            case XMLAttDef::ID:             attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedIDAttribute); break;
            case XMLAttDef::IDRef:          attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedIDREFAttribute); break;
            case XMLAttDef::IDRefs:         attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedIDREFSAttribute); break;
            case XMLAttDef::Entity:         attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedENTITYAttribute); break;
            case XMLAttDef::Entities:       attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedENTITIESAttribute); break;
            case XMLAttDef::NmToken:        attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedNMTOKENAttribute); break;
            case XMLAttDef::NmTokens:       attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedNMTOKENSAttribute); break;
            case XMLAttDef::Notation:       attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedNOTATIONAttribute); break;
            case XMLAttDef::Enumeration:    attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedENUMERATIONAttribute); break;
            default:                        attr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdNotValidatedAttribute); break;
            }
        }
      }
    }

    //Set up the default attributes if any.
    //
    if (elemDecl.hasAttDefs())
    {
        XMLAttDefList* defAttrs = &elemDecl.getAttDefList();
        XMLAttDef* attr = 0;
        DOMAttrImpl * insertAttr = 0;

        for(XMLSize_t i=0; i<defAttrs->getAttDefCount(); i++)
        {
            attr = &defAttrs->getAttDef(i);

            const XMLAttDef::DefAttTypes defType = attr->getDefaultType();
            if ((defType == XMLAttDef::Default)
            ||  (defType == XMLAttDef::Fixed))
            {

                if (doNamespaces)
                {
                    // DOM Level 2 wants all namespace declaration attributes
                    // to be bound to "http://www.w3.org/2000/xmlns/"
                    // So as long as the XML parser doesn't do it, it needs to
                    // be done here.
                    const XMLCh* qualifiedName = attr->getFullName();
                    XMLBufBid bbPrefixQName(&fBufMgr);
                    XMLBuffer& prefixBuf = bbPrefixQName.getBuffer();
                    int colonPos = -1;
                    unsigned int uriId = fScanner->resolveQName(qualifiedName, prefixBuf, ElemStack::Mode_Attribute, colonPos);

                    const XMLCh* namespaceURI = 0;
                    if (XMLString::equals(qualifiedName, XMLUni::fgXMLNSString))    //for xmlns=...
                        uriId = fScanner->getXMLNSNamespaceId();
                    if (uriId != fScanner->getEmptyNamespaceId()) {  //TagName has a prefix
                        namespaceURI = fScanner->getURIText(uriId);
                    }

                    insertAttr = (DOMAttrImpl *) fDocument->createAttributeNS(namespaceURI,     // NameSpaceURI
                                                                              qualifiedName);   // qualified name

                    DOMAttr* remAttr = elemImpl->setDefaultAttributeNodeNS(insertAttr);
                    if (remAttr)
                        remAttr->release();
                }
                else
                {
                    // Namespaces is turned off...
                    insertAttr = (DOMAttrImpl *) fDocument->createAttribute(attr->getFullName());

                    DOMNode* remAttr = elemImpl->setDefaultAttributeNode(insertAttr);
                    if (remAttr)
                        remAttr->release();
                }
                //need to do this before the get as otherwise we overwrite any value in the attr
                if (attr->getValue() != 0)
                {
                    insertAttr->setValueFast(attr->getValue());
                    insertAttr->setSpecified(false);
                }

                // store DTD validation information
                if(fCreateSchemaInfo)
                {
                    switch(attr->getType())
                    {
                    case XMLAttDef::CData:          insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedCDATAAttribute); break;
                    case XMLAttDef::ID:             insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedIDAttribute); break;
                    case XMLAttDef::IDRef:          insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedIDREFAttribute); break;
                    case XMLAttDef::IDRefs:         insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedIDREFSAttribute); break;
                    case XMLAttDef::Entity:         insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedENTITYAttribute); break;
                    case XMLAttDef::Entities:       insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedENTITIESAttribute); break;
                    case XMLAttDef::NmToken:        insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedNMTOKENAttribute); break;
                    case XMLAttDef::NmTokens:       insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedNMTOKENSAttribute); break;
                    case XMLAttDef::Notation:       insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedNOTATIONAttribute); break;
                    case XMLAttDef::Enumeration:    insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdValidatedENUMERATIONAttribute); break;
                    default:                        insertAttr->setSchemaTypeInfo(&DOMTypeInfoImpl::g_DtdNotValidatedAttribute); break;
                    }
                }
            }

            insertAttr = 0;
            attr->reset();
        }
    }

    if (fCurrentParent != fDocument)
      castToParentImpl (fCurrentParent)->appendChildFast (elem);
    else
      fCurrentParent->appendChild (elem);

    fCurrentParent = elem;
    fCurrentNode = elem;
    fWithinElement = true;

    // If an empty element, do end right now (no endElement() will be called)
    if (isEmpty)
        endElement(elemDecl, urlId, isRoot, elemPrefix);
}